

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

SpatialVector *
RigidBodyDynamics::CalcPointAcceleration6D
          (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDot,uint body_id,
          Vector3d *point_position,bool update_kinematics)

{
  bool bVar1;
  reference pvVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *other_00;
  long in_RSI;
  SpatialVector *in_RDI;
  uint in_R9D;
  byte in_stack_00000010;
  VectorNd *in_stack_000000b8;
  VectorNd *in_stack_000000c0;
  VectorNd *in_stack_000000c8;
  Model *in_stack_000000d0;
  Vector3d a_dash;
  SpatialVector p_v_i;
  SpatialTransform p_X_i;
  Vector3d base_coords;
  uint fbody_id;
  Vector3d reference_point;
  uint reference_body_id;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd08;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_fffffffffffffd10;
  Matrix3d *in_stack_fffffffffffffd18;
  SpatialTransform *in_stack_fffffffffffffd20;
  Model *in_stack_fffffffffffffd28;
  double *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  Vector3_t *in_stack_fffffffffffffd60;
  double *in_stack_fffffffffffffd68;
  double *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  double *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  SpatialVector_t *in_stack_fffffffffffffd90;
  Model *in_stack_fffffffffffffd98;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffda0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffda8;
  SpatialVector *in_stack_fffffffffffffed0;
  SpatialTransform *in_stack_fffffffffffffed8;
  undefined1 in_stack_ffffffffffffff1f;
  Vector3d *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff2c;
  VectorNd *in_stack_ffffffffffffff30;
  Model *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff4f;
  Vector3d *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff5c;
  VectorNd *in_stack_ffffffffffffff60;
  Model *in_stack_ffffffffffffff68;
  uint local_34;
  
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd10);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x88),
             0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd10);
  if ((in_stack_00000010 & 1) != 0) {
    UpdateKinematics(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  Vector3_t::Vector3_t
            ((Vector3_t *)in_stack_fffffffffffffd10,(Vector3_t *)in_stack_fffffffffffffd08);
  bVar1 = Model::IsFixedBodyId
                    (in_stack_fffffffffffffd28,(uint)((ulong)in_stack_fffffffffffffd20 >> 0x20));
  local_34 = in_R9D;
  if (bVar1) {
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x318),(ulong)(in_R9D - *(int *)(in_RSI + 0x330)));
    local_34 = pvVar2->mMovableParent;
    CalcBodyToBaseCoordinates
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    CalcBaseToBodyCoordinates
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffffd10,(Vector3_t *)in_stack_fffffffffffffd08);
  }
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffd98,(VectorNd *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd8c,SUB41((uint)in_stack_fffffffffffffd88 >> 0x18,0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd08);
  Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffffd10,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffffd08);
  Math::SpatialTransform::SpatialTransform
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (Vector3d *)in_stack_fffffffffffffd10);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             (ulong)local_34);
  Math::SpatialTransform::apply(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                   (in_stack_fffffffffffffd10,(Index)in_stack_fffffffffffffd08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffd08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffd08);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (double *)in_RDI);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffd08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffd08);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffd08);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (double *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  Vector3_t::Vector3_t<Eigen::Matrix<double,3,1,0,3,1>>((Vector3_t *)this,in_stack_fffffffffffffd08)
  ;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x88),
             (ulong)local_34);
  Math::SpatialTransform::apply(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  other = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,
                     (Index)in_stack_fffffffffffffd08);
  this_00 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,
                       (Index)in_stack_fffffffffffffd08);
  other_00 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,
                           (Index)in_stack_fffffffffffffd08);
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffffd90,
             (double *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68,(double *)in_stack_fffffffffffffda0);
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+(this_00,other);
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
            ((SpatialVector_t *)this,other_00);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI SpatialVector CalcPointAcceleration6D(
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &QDDot,
    unsigned int body_id,
    const Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics)
    UpdateKinematics (model, Q, QDot, QDDot);

  LOG << std::endl;

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates (model, Q, body_id, point_position, false);
    reference_point = 
      CalcBaseToBodyCoordinates (model, Q, reference_body_id,base_coords,false);
  }

  SpatialTransform p_X_i (
      CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(),
      reference_point);

  SpatialVector p_v_i = p_X_i.apply(model.v[reference_body_id]);
  Vector3d a_dash = Vector3d (p_v_i[0], p_v_i[1], p_v_i[2]
      ).cross(Vector3d (p_v_i[3], p_v_i[4], p_v_i[5]));
  return (p_X_i.apply(model.a[reference_body_id]) 
      + SpatialVector (0, 0, 0, a_dash[0], a_dash[1], a_dash[2]));
}